

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpmemorymanager.h
# Opt level: O0

void jrtplib::RTPDelete<jrtplib::RTPUDPv4Transmitter::PortInfo>(PortInfo *obj,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  PortInfo *obj_local;
  
  if (mgr == (RTPMemoryManager *)0x0) {
    if (obj != (PortInfo *)0x0) {
      RTPUDPv4Transmitter::PortInfo::~PortInfo(obj);
      operator_delete(obj,0x20);
    }
  }
  else {
    RTPUDPv4Transmitter::PortInfo::~PortInfo(obj);
    (*mgr->_vptr_RTPMemoryManager[3])(mgr,obj);
  }
  return;
}

Assistant:

inline void RTPDelete(ClassName *obj, RTPMemoryManager *mgr)
{
	if (mgr == 0)
		delete obj;
	else
	{
		obj->~ClassName();
		mgr->FreeBuffer(obj);
	}
}